

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void simd::Invert(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                 uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t rowSizeOut_00;
  uint simdWidth_00;
  uint32_t nonSimdWidth_00;
  uchar *puVar5;
  uchar *puVar6;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  uint32_t unaff_retaddr;
  uint32_t in_stack_00000008;
  SIMDType in_stack_00000010;
  SIMDType in_stack_00000018;
  uint32_t nonSimdWidth;
  uint32_t totalSimdWidth;
  uint32_t simdWidth;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint32_t simdSize;
  uint8_t colorCount;
  undefined4 in_stack_ffffffffffffff4c;
  SIMDType SVar7;
  undefined4 in_stack_ffffffffffffff54;
  uint32_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  uint8_t *in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  uint8_t *in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffdc;
  uint startXOut_00;
  
  uVar1 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                    (in_stack_ffffffffffffff60,
                     (ImageTemplate<unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  startXOut_00 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffdc);
  uVar2 = getSimdSize(in_stack_00000018);
  if ((in_stack_00000018 == cpu_function) || (in_stack_00000008 * (startXOut_00 >> 0x18) < uVar2)) {
    uVar4 = (uint32_t)((ulong)in_RCX >> 0x20);
    if (in_stack_00000018 == avx_function) {
      Invert((Image *)CONCAT44(in_ESI,in_EDX),uVar4,(uint32_t)in_RCX,
             (Image *)CONCAT44(in_R8D,in_R9D),startXOut_00,uVar2,unaff_retaddr,in_stack_00000008,
             in_stack_00000010);
    }
    else {
      Image_Function::Invert
                ((Image *)CONCAT44(in_ESI,in_EDX),uVar4,(uint32_t)in_RCX,
                 (Image *)CONCAT44(in_R8D,in_R9D),startXOut_00,uVar2,unaff_retaddr,in_stack_00000008
                );
    }
  }
  else {
    uVar4 = in_stack_00000008;
    SVar7 = in_stack_00000010;
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
               (ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff98);
    uVar3 = in_stack_00000008 * (startXOut_00 >> 0x18);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff54,SVar7),
               (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff4c,uVar4));
    Image_Function::
    OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
              ((uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,
               (ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x17a7e7);
    uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    rowSizeOut_00 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
    puVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    puVar5 = puVar5 + (ulong)(in_ESI * (startXOut_00 >> 0x18)) + (ulong)(in_EDX * uVar4);
    puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
    simdWidth_00 = uVar3 / uVar2;
    uVar2 = simdWidth_00 * uVar2;
    nonSimdWidth_00 = uVar3 - uVar2;
    if (in_stack_00000018 == avx_function) {
      avx::Invert(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                  in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                  nonSimdWidth_00,in_stack_ffffffffffffff58);
    }
    else if (in_stack_00000018 == sse_function) {
      sse::Invert(uVar4,rowSizeOut_00,puVar5,
                  puVar6 + (ulong)(in_R8D * (startXOut_00 >> 0x18)) +
                           (ulong)(in_R9D * rowSizeOut_00),
                  puVar6 + (ulong)(in_R8D * (startXOut_00 >> 0x18)) +
                           (ulong)(in_R9D * rowSizeOut_00) + in_stack_00000010 * rowSizeOut_00,
                  simdWidth_00,uVar2,nonSimdWidth_00);
    }
  }
  return;
}

Assistant:

void Invert( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( Invert( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::Invert( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Invert( rowSizeIn, rowSizeOut, inY, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }